

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

string * Catch::toString(string *__return_storage_ptr__,string *value)

{
  undefined8 *puVar1;
  long lVar2;
  string *psVar3;
  char cVar4;
  IMutableContext *pIVar5;
  long *plVar6;
  undefined8 *puVar7;
  char *pcVar8;
  ulong *puVar9;
  size_type *psVar10;
  ulong uVar11;
  pointer pcVar12;
  undefined1 *local_f8 [2];
  undefined1 local_e8 [16];
  string *local_d8;
  undefined1 local_d0 [8];
  string s;
  ulong local_a0;
  long lStack_98;
  ulong *local_90;
  long local_88;
  ulong local_80 [2];
  undefined8 *local_70;
  undefined8 local_68;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined1 local_50 [8];
  string subs;
  
  local_d0 = (undefined1  [8])&s._M_string_length;
  pcVar12 = (value->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_d0,pcVar12,pcVar12 + value->_M_string_length);
  pIVar5 = getCurrentMutableContext();
  (*(pIVar5->super_IContext)._vptr_IContext[6])(local_50);
  cVar4 = (**(code **)(*(size_type *)local_50 + 0x58))();
  local_d8 = __return_storage_ptr__;
  if (local_50 != (undefined1  [8])0x0) {
    (**(code **)(*(size_type *)local_50 + 0x18))();
  }
  if ((cVar4 != '\0') && (s._M_dataplus._M_p != (pointer)0x0)) {
    psVar10 = &subs._M_string_length;
    pcVar12 = (pointer)0x0;
    do {
      subs._M_dataplus._M_p = (pointer)0x0;
      subs._M_string_length._0_1_ = 0;
      local_50 = (undefined1  [8])psVar10;
      if (*(char *)((long)local_d0 + (long)pcVar12) == '\t') {
        pcVar8 = "\\t";
LAB_0012e4ca:
        std::__cxx11::string::_M_replace((ulong)local_50,0,(char *)0x0,(ulong)pcVar8);
      }
      else {
        pcVar8 = "\\n";
        if (*(char *)((long)local_d0 + (long)pcVar12) == '\n') goto LAB_0012e4ca;
      }
      if (subs._M_dataplus._M_p != (pointer)0x0) {
        std::__cxx11::string::substr((ulong)local_f8,(ulong)local_d0);
        plVar6 = (long *)std::__cxx11::string::_M_append((char *)local_f8,(ulong)local_50);
        puVar9 = (ulong *)(plVar6 + 2);
        if ((ulong *)*plVar6 == puVar9) {
          local_a0 = *puVar9;
          lStack_98 = plVar6[3];
          s.field_2._8_8_ = &local_a0;
        }
        else {
          local_a0 = *puVar9;
          s.field_2._8_8_ = (ulong *)*plVar6;
        }
        lVar2 = plVar6[1];
        *plVar6 = (long)puVar9;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        pcVar12 = pcVar12 + 1;
        std::__cxx11::string::substr((ulong)&local_90,(ulong)local_d0);
        uVar11 = 0xf;
        if ((ulong *)s.field_2._8_8_ != &local_a0) {
          uVar11 = local_a0;
        }
        if (uVar11 < (ulong)(local_88 + lVar2)) {
          uVar11 = 0xf;
          if (local_90 != local_80) {
            uVar11 = local_80[0];
          }
          if (uVar11 < (ulong)(local_88 + lVar2)) goto LAB_0012e5bb;
          puVar7 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_90,0,(char *)0x0,s.field_2._8_8_);
        }
        else {
LAB_0012e5bb:
          puVar7 = (undefined8 *)
                   std::__cxx11::string::_M_append(s.field_2._M_local_buf + 8,(ulong)local_90);
        }
        local_70 = &local_60;
        puVar1 = puVar7 + 2;
        if ((undefined8 *)*puVar7 == puVar1) {
          local_60 = *puVar1;
          uStack_58 = puVar7[3];
        }
        else {
          local_60 = *puVar1;
          local_70 = (undefined8 *)*puVar7;
        }
        local_68 = puVar7[1];
        *puVar7 = puVar1;
        puVar7[1] = 0;
        *(undefined1 *)puVar1 = 0;
        std::__cxx11::string::operator=((string *)local_d0,(string *)&local_70);
        if (local_70 != &local_60) {
          operator_delete(local_70);
        }
        if (local_90 != local_80) {
          operator_delete(local_90);
        }
        if ((ulong *)s.field_2._8_8_ != &local_a0) {
          operator_delete((void *)s.field_2._8_8_);
        }
        if (local_f8[0] != local_e8) {
          operator_delete(local_f8[0]);
        }
      }
      if (local_50 != (undefined1  [8])psVar10) {
        operator_delete((void *)local_50);
      }
      pcVar12 = pcVar12 + 1;
    } while (pcVar12 < s._M_dataplus._M_p);
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,"\"",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0);
  plVar6 = (long *)std::__cxx11::string::append(local_50);
  psVar3 = local_d8;
  (local_d8->_M_dataplus)._M_p = (pointer)&local_d8->field_2;
  psVar10 = (size_type *)(plVar6 + 2);
  if ((size_type *)*plVar6 == psVar10) {
    lVar2 = plVar6[3];
    (local_d8->field_2)._M_allocated_capacity = *psVar10;
    *(long *)((long)&local_d8->field_2 + 8) = lVar2;
  }
  else {
    (local_d8->_M_dataplus)._M_p = (pointer)*plVar6;
    (local_d8->field_2)._M_allocated_capacity = *psVar10;
  }
  local_d8->_M_string_length = plVar6[1];
  *plVar6 = (long)psVar10;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  if (local_50 != (undefined1  [8])&subs._M_string_length) {
    operator_delete((void *)local_50);
  }
  if (local_d0 != (undefined1  [8])&s._M_string_length) {
    operator_delete((void *)local_d0);
  }
  return psVar3;
}

Assistant:

std::string toString( std::string const& value ) {
    std::string s = value;
    if( getCurrentContext().getConfig()->showInvisibles() ) {
        for(size_t i = 0; i < s.size(); ++i ) {
            std::string subs;
            switch( s[i] ) {
            case '\n': subs = "\\n"; break;
            case '\t': subs = "\\t"; break;
            default: break;
            }
            if( !subs.empty() ) {
                s = s.substr( 0, i ) + subs + s.substr( i+1 );
                ++i;
            }
        }
    }
    return "\"" + s + "\"";
}